

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

void DepParserTask::get_valid_actions
               (search *sch,v_array<unsigned_int> *valid_action,uint64_t idx,uint64_t n,
               uint64_t stack_depth,uint64_t state)

{
  v_array<unsigned_int> *this;
  void *pvVar1;
  long lVar2;
  uint local_48 [2];
  uint64_t local_40;
  uint64_t local_38;
  
  pvVar1 = sch->task_data;
  v_array<unsigned_int>::clear(valid_action);
  if (*(int *)((long)pvVar1 + 0x2c4) != 2) {
    if (*(int *)((long)pvVar1 + 0x2c4) != 1) {
      return;
    }
    if (idx <= n) {
      v_array<unsigned_int>::push_back(valid_action,&SHIFT);
    }
    if (1 < stack_depth) {
      v_array<unsigned_int>::push_back(valid_action,&REDUCE_RIGHT);
    }
    if (n < idx) {
      return;
    }
    if (stack_depth == 0) {
      return;
    }
    if (state == 0) {
      return;
    }
    v_array<unsigned_int>::push_back(valid_action,&REDUCE_LEFT);
    return;
  }
  this = (v_array<unsigned_int> *)((long)pvVar1 + 0xf8);
  local_40 = n;
  local_38 = idx;
  v_array<unsigned_int>::clear(this);
  lVar2 = 5;
  do {
    local_48[1] = 1;
    v_array<unsigned_int>::push_back(this,local_48 + 1);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  if (local_40 < local_38) {
    this->_begin[1] = 0;
    this->_begin[2] = 0;
  }
  if (stack_depth == 0) {
    this->_begin[4] = 0;
    this->_begin[3] = 0;
  }
  else {
    lVar2 = *(long *)((long)pvVar1 + 0xb8);
    if ((local_38 <= local_40 + 1) &&
       (*(int *)(lVar2 + (ulong)*(uint *)(*(long *)((long)pvVar1 + 0xa0) + -4) * 4) == 9999999)) {
      *(undefined4 *)(*(long *)((long)pvVar1 + 0xf8) + 0x10) = 0;
      lVar2 = *(long *)((long)pvVar1 + 0xb8);
    }
    if (*(int *)(lVar2 + (ulong)*(uint *)(*(long *)((long)pvVar1 + 0xa0) + -4) * 4) != 9999999) {
      this->_begin[3] = 0;
    }
    if ((local_40 < local_38) ||
       (*(int *)(*(long *)((long)pvVar1 + 0xb8) + local_38 * 4) == 9999999)) goto LAB_002717d4;
  }
  this->_begin[2] = 0;
LAB_002717d4:
  local_48[0] = 1;
  do {
    if (this->_begin[local_48[0]] != 0) {
      v_array<unsigned_int>::push_back(valid_action,local_48);
    }
    local_48[0] = local_48[0] + 1;
  } while (local_48[0] < 5);
  return;
}

Assistant:

void get_valid_actions(Search::search &sch, v_array<uint32_t> &valid_action, uint64_t idx, uint64_t n,
    uint64_t stack_depth, uint64_t state)
{
  task_data *data = sch.get_task_data<task_data>();
  uint32_t &sys = data->transition_system;
  v_array<uint32_t> &stack = data->stack, &heads = data->heads, &temp = data->temp;
  valid_action.clear();
  if (sys == arc_hybrid)
  {
    if (idx <= n)  // SHIFT
      valid_action.push_back(SHIFT);
    if (stack_depth >= 2)  // RIGHT
      valid_action.push_back(REDUCE_RIGHT);
    if (stack_depth >= 1 && state != 0 && idx <= n)  // LEFT
      valid_action.push_back(REDUCE_LEFT);
  }
  else if (sys == arc_eager)  // assume root is in N+1
  {
    temp.clear();
    for (size_t i = 0; i <= 4; i++) temp.push_back(1);
    if (idx > n)
    {
      temp[SHIFT] = 0;
      temp[REDUCE_RIGHT] = 0;
    }

    if (stack_depth == 0)
      temp[REDUCE] = 0;
    else if (idx <= n + 1 && heads[stack.last()] == my_null)
      temp[REDUCE] = 0;

    if (stack_depth == 0)
    {
      temp[REDUCE_LEFT] = 0;
      temp[REDUCE_RIGHT] = 0;
    }
    else
    {
      if (heads[stack.last()] != my_null)
        temp[REDUCE_LEFT] = 0;
      if (idx <= n && heads[idx] != my_null)
        temp[REDUCE_RIGHT] = 0;
    }
    for (uint32_t i = 1; i <= 4; i++)
    {
      if (temp[i])
        valid_action.push_back(i);
    }
  }
}